

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_2::addVertexAndFragmentShaders
               (SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [40];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec4 a_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 v_vertex_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_Position = a_position;\n");
  poVar2 = std::operator<<(poVar2,
                           "    v_vertex_color = vec4(a_position.x * 0.5 + 0.5, a_position.y * 0.5 + 0.5, 1.0, 0.4);\n"
                          );
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"vert",&local_1f1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1b0,&local_1f0);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b0);
  std::__cxx11::string::~string((string *)(local_1b0 + 8));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp   vec4 v_fragment_color;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tfragColor = v_fragment_color;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"frag",&local_1f1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1b0,&local_1f0);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1b0);
  std::__cxx11::string::~string((string *)(local_1b0 + 8));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void addVertexAndFragmentShaders (vk::SourceCollections&  programCollection)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 a_position;\n"
			<< "layout(location = 0) out highp vec4 v_vertex_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = a_position;\n"
			<< "    v_vertex_color = vec4(a_position.x * 0.5 + 0.5, a_position.y * 0.5 + 0.5, 1.0, 0.4);\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp   vec4 v_fragment_color;\n"
			<< "layout(location = 0) out mediump vec4 fragColor;\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "	fragColor = v_fragment_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}